

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O2

ZyanStatus
ZydisFormatterIntelPrintDISP
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanU64 ZVar1;
  ZyanStatus ZVar2;
  ZydisDecodedOperand *pZVar3;
  ZyanU64 ZVar4;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x14a,
                  "ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x14b,
                  "ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x14c,
                  "ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (formatter->disp_signedness < ZYDIS_SIGNEDNESS_MAX_VALUE) {
    pZVar3 = context->operand;
    if (-1 < (pZVar3->field_10).mem.disp.value) goto LAB_0011e364;
    if (((pZVar3->field_10).mem.base != ZYDIS_REGISTER_NONE) ||
       ((pZVar3->field_10).mem.index != ZYDIS_REGISTER_NONE)) {
      if (buffer->is_token_list == '\0') {
        ZVar2 = ZydisStringAppendShort(&buffer->string,&STR_SUB);
      }
      else {
        ZVar2 = ZydisFormatterBufferAppendPredefined(buffer,(ZydisPredefinedToken *)&TOK_DATA_SUB);
      }
      if ((int)ZVar2 < 0) {
        return ZVar2;
      }
    }
    if ((buffer->is_token_list != '\0') &&
       (ZVar2 = ZydisFormatterBufferAppend(buffer,'\n'), (int)ZVar2 < 0)) {
      return ZVar2;
    }
    if (formatter->disp_base == ZYDIS_NUMERIC_BASE_HEX) {
      ZVar1 = (context->operand->field_10).mem.disp.value;
      ZVar4 = -ZVar1;
      if (0 < (long)ZVar1) {
        ZVar4 = ZVar1;
      }
      goto LAB_0011e489;
    }
    if (formatter->disp_base != ZYDIS_NUMERIC_BASE_DEC) {
      return 0x80100004;
    }
    ZVar1 = (context->operand->field_10).mem.disp.value;
    ZVar4 = -ZVar1;
    if (0 < (long)ZVar1) {
      ZVar4 = ZVar1;
    }
  }
  else {
    if (formatter->disp_signedness != ZYDIS_SIGNEDNESS_MAX_VALUE) {
      return 0x80100004;
    }
    pZVar3 = context->operand;
LAB_0011e364:
    if (((pZVar3->field_10).mem.base != ZYDIS_REGISTER_NONE) ||
       ((pZVar3->field_10).mem.index != ZYDIS_REGISTER_NONE)) {
      if (buffer->is_token_list == '\0') {
        ZVar2 = ZydisStringAppendShort(&buffer->string,&STR_ADD);
      }
      else {
        ZVar2 = ZydisFormatterBufferAppendPredefined(buffer,(ZydisPredefinedToken *)&TOK_DATA_ADD);
      }
      if ((int)ZVar2 < 0) {
        return ZVar2;
      }
    }
    if ((buffer->is_token_list != '\0') &&
       (ZVar2 = ZydisFormatterBufferAppend(buffer,'\n'), (int)ZVar2 < 0)) {
      return ZVar2;
    }
    if (formatter->disp_base == ZYDIS_NUMERIC_BASE_HEX) {
      ZVar4 = (context->operand->field_10).mem.disp.value;
LAB_0011e489:
      ZVar2 = ZydisStringAppendHexU
                        (&buffer->string,ZVar4,(char)formatter->disp_padding,
                         formatter->hex_force_leading_number,formatter->hex_uppercase,
                         formatter->number_format[1][0].string,formatter->number_format[1][1].string
                        );
      goto LAB_0011e4b2;
    }
    if (formatter->disp_base != ZYDIS_NUMERIC_BASE_DEC) {
      return 0x80100004;
    }
    ZVar4 = (context->operand->field_10).mem.disp.value;
  }
  ZVar2 = ZydisStringAppendDecU
                    (&buffer->string,ZVar4,(char)formatter->disp_padding,
                     formatter->number_format[0][0].string,formatter->number_format[0][1].string);
LAB_0011e4b2:
  if (-1 < (int)ZVar2) {
    ZVar2 = 0x100000;
  }
  return ZVar2;
}

Assistant:

ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    switch (formatter->disp_signedness)
    {
    case ZYDIS_SIGNEDNESS_AUTO:
    case ZYDIS_SIGNEDNESS_SIGNED:
        if (context->operand->mem.disp.value < 0)
        {
            if ((context->operand->mem.base  != ZYDIS_REGISTER_NONE) ||
                (context->operand->mem.index != ZYDIS_REGISTER_NONE))
            {
                ZYDIS_BUFFER_APPEND(buffer, SUB);
            }
            ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DISPLACEMENT);
            ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->disp_base, &buffer->string,
                ZyanAbsI64(context->operand->mem.disp.value), formatter->disp_padding,
                formatter->hex_force_leading_number);
            break;
        }
        ZYAN_FALLTHROUGH;
    case ZYDIS_SIGNEDNESS_UNSIGNED:
        if ((context->operand->mem.base  != ZYDIS_REGISTER_NONE) ||
            (context->operand->mem.index != ZYDIS_REGISTER_NONE))
        {
            ZYDIS_BUFFER_APPEND(buffer, ADD);
        }
        ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DISPLACEMENT);
        ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->disp_base, &buffer->string,
            context->operand->mem.disp.value, formatter->disp_padding,
            formatter->hex_force_leading_number);
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    return ZYAN_STATUS_SUCCESS;
}